

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

Uint32 load_shader(GPU_ShaderEnum shader_type,char *filename)

{
  int iVar1;
  GPU_Renderer *pGVar2;
  long lVar3;
  size_t sVar4;
  char *__dest;
  size_t sVar5;
  GPU_Renderer *renderer;
  char *header;
  int file_size;
  int header_size;
  char *source;
  Uint32 shader;
  SDL_RWops *rwops;
  char *filename_local;
  GPU_ShaderEnum shader_type_local;
  
  renderer = (GPU_Renderer *)0x218663;
  pGVar2 = GPU_GetCurrentRenderer();
  lVar3 = SDL_RWFromFile(filename,"rb");
  if (lVar3 == 0) {
    GPU_PushErrorCode("load_shader",GPU_ERROR_FILE_NOT_FOUND,"Shader file \"%s\" not found",filename
                     );
    filename_local._4_4_ = 0;
  }
  else {
    iVar1 = SDL_RWseek(lVar3,0,2);
    SDL_RWseek(lVar3,0,0);
    if (pGVar2->shader_language == GPU_LANGUAGE_GLSL) {
      if (pGVar2->max_shader_version < 0x78) {
        renderer = (GPU_Renderer *)anon_var_dwarf_99;
      }
      else {
        renderer = (GPU_Renderer *)anon_var_dwarf_83;
      }
    }
    else if (pGVar2->shader_language == GPU_LANGUAGE_GLSLES) {
      renderer = (GPU_Renderer *)anon_var_dwarf_a3;
    }
    sVar4 = strlen((char *)renderer);
    __dest = (char *)malloc((long)((int)sVar4 + iVar1 + 1));
    strcpy(__dest,(char *)renderer);
    sVar5 = strlen(__dest);
    SDL_RWread(lVar3,__dest + sVar5,1,(long)iVar1);
    __dest[(int)sVar4 + iVar1] = '\0';
    filename_local._4_4_ = GPU_CompileShader(shader_type,__dest);
    free(__dest);
    SDL_RWclose(lVar3);
  }
  return filename_local._4_4_;
}

Assistant:

Uint32 load_shader(GPU_ShaderEnum shader_type, const char* filename)
{
    SDL_RWops* rwops;
    Uint32 shader;
    char* source;
    int header_size, file_size;
    const char* header = "";
    GPU_Renderer* renderer = GPU_GetCurrentRenderer();
    
    // Open file
    rwops = SDL_RWFromFile(filename, "rb");
    if(rwops == NULL)
    {
        GPU_PushErrorCode("load_shader", GPU_ERROR_FILE_NOT_FOUND, "Shader file \"%s\" not found", filename);
        return 0;
    }
    
    // Get file size
    file_size = SDL_RWseek(rwops, 0, SEEK_END);
    SDL_RWseek(rwops, 0, SEEK_SET);
    
    // Get size from header
    if(renderer->shader_language == GPU_LANGUAGE_GLSL)
    {
        if(renderer->max_shader_version >= 120)
            header = "#version 120\n";
        else
            header = "#version 110\n";  // Maybe this is good enough?
    }
    else if(renderer->shader_language == GPU_LANGUAGE_GLSLES)
        header = "#version 100\nprecision mediump int;\nprecision mediump float;\n";
    
    header_size = strlen(header);
    
    // Allocate source buffer
    source = (char*)malloc(sizeof(char)*(header_size + file_size + 1));
    
    // Prepend header
    strcpy(source, header);
    
    // Read in source code
    SDL_RWread(rwops, source + strlen(source), 1, file_size);
    source[header_size + file_size] = '\0';
    
    // Compile the shader
    shader = GPU_CompileShader(shader_type, source);
    
    // Clean up
    free(source);
    SDL_RWclose(rwops);
    
    return shader;
}